

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O2

string * __thiscall
cmLinkLineComputer::ConvertToLinkReference
          (string *__return_storage_ptr__,cmLinkLineComputer *this,string *lib)

{
  bool bVar1;
  char *pcVar2;
  cmStateDirectory *this_00;
  allocator local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)lib);
  this_00 = &this->StateDir;
  pcVar2 = cmStateDirectory::GetCurrentBinary(this_00);
  std::__cxx11::string::string((string *)&local_60,pcVar2,(allocator *)&local_40);
  bVar1 = cmOutputConverter::ContainedInDirectory(&local_60,lib,this_00);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    pcVar2 = cmStateDirectory::GetCurrentBinary(this_00);
    std::__cxx11::string::string((string *)&local_40,pcVar2,&local_61);
    cmOutputConverter::ForceToRelativePath(&local_60,&local_40,lib);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ConvertToLinkReference(
  std::string const& lib) const
{
  std::string relLib = lib;

  if (cmOutputConverter::ContainedInDirectory(
        this->StateDir.GetCurrentBinary(), lib, this->StateDir)) {
    relLib = cmOutputConverter::ForceToRelativePath(
      this->StateDir.GetCurrentBinary(), lib);
  }
  return relLib;
}